

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  long lVar3;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar4;
  
  pIVar1 = GImGui;
  IVar2 = ImHashStr(type_name,0,0);
  lVar3 = (long)(pIVar1->SettingsHandlers).Size;
  if (lVar3 != 0) {
    pIVar4 = (pIVar1->SettingsHandlers).Data;
    lVar3 = lVar3 * 0x48;
    do {
      if (pIVar4->TypeHash == IVar2) {
        return pIVar4;
      }
      pIVar4 = pIVar4 + 1;
      lVar3 = lVar3 + -0x48;
    } while (lVar3 != 0);
  }
  return (ImGuiSettingsHandler *)0x0;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.TypeHash == type_hash)
            return &handler;
    return NULL;
}